

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_lset(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi_uint local_28;
  int ret;
  mbedtls_mpi_sint z_local;
  mbedtls_mpi *X_local;
  
  iVar1 = mbedtls_mpi_grow(X,1);
  if (iVar1 == 0) {
    memset(X->p,0,X->n << 3);
    local_28 = z;
    if (z < 0) {
      local_28 = -z;
    }
    *X->p = local_28;
    iVar2 = 1;
    if (z < 0) {
      iVar2 = -1;
    }
    X->s = iVar2;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_lset( mbedtls_mpi *X, mbedtls_mpi_sint z )
{
    int ret;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, 1 ) );
    memset( X->p, 0, X->n * ciL );

    X->p[0] = ( z < 0 ) ? -z : z;
    X->s    = ( z < 0 ) ? -1 : 1;

cleanup:

    return( ret );
}